

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

float * stbi_loadf(char *filename,int *x,int *y,int *comp,int req_comp)

{
  FILE *__stream;
  float *pfVar1;
  long in_FS_OFFSET;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    *(char **)(in_FS_OFFSET + -0x20) = "can\'t fopen";
    pfVar1 = (float *)0x0;
  }
  else {
    pfVar1 = stbi_loadf_from_file((FILE *)__stream,x,y,comp,req_comp);
    fclose(__stream);
  }
  return pfVar1;
}

Assistant:

STBIDEF float *stbi_loadf(char const *filename, int *x, int *y, int *comp, int req_comp)
{
   float *result;
   FILE *f = stbi__fopen(filename, "rb");
   if (!f) return stbi__errpf("can't fopen", "Unable to open file");
   result = stbi_loadf_from_file(f,x,y,comp,req_comp);
   fclose(f);
   return result;
}